

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O3

void __thiscall
ConditionalEstimator::ConditionalEstimator
          (ConditionalEstimator *this,Property *property,StochasticProcess *stochvar,
          StochasticProcess *condition,Time *time,int pre,int post,int updateCorrection)

{
  int iVar1;
  uint uVar2;
  bool *pbVar3;
  double *pdVar4;
  double **ppdVar5;
  uint l;
  ulong uVar6;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Estimator","");
  Estimator::Estimator(&this->super_Estimator,stochvar,time,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ConditionalEstimator_0015b928;
  l = pre + post + 1;
  Ring<double>::Ring(&this->condSampleRing,l);
  pbVar3 = (bool *)operator_new__(0);
  (this->condEventRing).ringData = pbVar3;
  (this->condEventRing).ringDelayedAdd = false;
  (this->condEventRing).ringIsInitialised = false;
  (this->condEventRing).ringCurrentIndex = 0;
  (this->condEventRing).ringSize = 0;
  (this->condEventRing).ringCacheInvalid = true;
  Ring<double>::Ring(&this->condConditionRing,l);
  iVar1 = post + pre;
  uVar2 = *property;
  (this->super_Estimator).nEstimate = uVar2;
  (this->super_Estimator).pSource = stochvar;
  this->condTrigger = (StochasticEventGenerator *)0x0;
  this->condCondition = condition;
  (this->super_Estimator).nSamples = 0;
  this->condSamples = (double *)0x0;
  this->aOne = (double *)0x0;
  this->aTwo = (double *)0x0;
  this->aThree = (double *)0x0;
  this->aEvents = (double *)0x0;
  this->aDist = (double **)0x0;
  this->nDist = 0;
  this->nPre = pre;
  this->nPost = post;
  this->nUpdateCorrection = updateCorrection;
  if ((uVar2 & 1) != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-2 < iVar1) {
      uVar6 = (ulong)l << 3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->condSamples = pdVar4;
  }
  if ((uVar2 & 4) != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-2 < iVar1) {
      uVar6 = (ulong)l << 3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->aOne = pdVar4;
  }
  if ((uVar2 & 0x20) != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-2 < iVar1) {
      uVar6 = (ulong)l << 3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->aEvents = pdVar4;
  }
  if ((uVar2 & 8) != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-2 < iVar1) {
      uVar6 = (ulong)l << 3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->aTwo = pdVar4;
  }
  if ((uVar2 & 0x10) != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-2 < iVar1) {
      uVar6 = (ulong)l << 3;
    }
    pdVar4 = (double *)operator_new__(uVar6);
    this->aThree = pdVar4;
  }
  if ((uVar2 & 2) != 0) {
    this->nDist = 100;
    uVar6 = 0xffffffffffffffff;
    if (-2 < iVar1) {
      uVar6 = (ulong)l * 8;
    }
    ppdVar5 = (double **)operator_new__(uVar6);
    this->aDist = ppdVar5;
    if (-1 < iVar1) {
      uVar6 = 0;
      do {
        pdVar4 = (double *)operator_new__(800);
        this->aDist[uVar6] = pdVar4;
        uVar6 = uVar6 + 1;
      } while (l != uVar6);
    }
    this->aDistRange[0] = -5.0;
    this->aDistRange[1] = 65.0;
    *(undefined4 *)&this->dDistOffset = 0;
    *(undefined4 *)((long)&this->dDistOffset + 4) = 0xc0140000;
    *(undefined4 *)&this->dDistScale = 0x66666666;
    *(undefined4 *)((long)&this->dDistScale + 4) = 0x3fe66666;
  }
  (*(this->super_Estimator).super_Parametric._vptr_Parametric[4])(this);
  return;
}

Assistant:

ConditionalEstimator::ConditionalEstimator(const Property& property, StochasticProcess *stochvar, StochasticProcess *condition, Time *time,  int pre, int post, int updateCorrection)
	: Estimator(stochvar, time), condSampleRing(pre+post+1), condEventRing(0), condConditionRing(pre+post+1)
{
	nEstimate = property;
	pSource = stochvar;
	condTrigger = 0;
	condCondition = condition;
	nSamples = 0;
	aDist = 0;
	nDist = 0;
	condSamples = 0;
	aOne = 0;
	aTwo = 0;
	aThree = 0;
	aEvents = 0;
	nPre = pre;
	nPost = post;
	nUpdateCorrection = updateCorrection;
	if(nEstimate & EST_SAMPLE)
		condSamples = new double[pre+post+1];
	if(nEstimate & EST_MEAN)
		aOne = new double[pre+post+1];
	if(nEstimate & EST_EVENTS)
		aEvents = new double[pre+post+1];
	if(nEstimate & EST_VAR)
		aTwo = new double[pre+post+1];
	if(nEstimate & EST_CUR)
		aThree = new double[pre+post+1];
	if(nEstimate & EST_DENS) {
		nDist = 100;
		aDist = new double *[pre+post+1];
		for( int i=0; i<pre+post+1; i++ )
			aDist[i] = new double[nDist];
		aDistRange[0] = -5.0;
		aDistRange[1] = 65.0;
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
	init();
}